

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O1

connection __thiscall
obs::signal<void_(int)>::connect<A>(signal<void_(int)> *this,offset_in_A_to_subr m,A *t)

{
  slot<void_(int)> *value;
  undefined8 *puVar1;
  undefined8 in_RCX;
  connection cVar2;
  
  value = (slot<void_(int)> *)operator_new(0x28);
  (value->super_slot_base)._vptr_slot_base = (_func_int **)&PTR__slot_00106ce0;
  *(undefined8 *)&(value->f).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(value->f).super__Function_base._M_functor + 8) = 0;
  (value->f).super__Function_base._M_manager = (_Manager_type)0x0;
  (value->f)._M_invoker = (_Invoker_type)0x0;
  puVar1 = (undefined8 *)operator_new(0x18);
  *puVar1 = in_RCX;
  puVar1[1] = m;
  puVar1[2] = t;
  *(undefined8 **)&(value->f).super__Function_base._M_functor = puVar1;
  (value->f)._M_invoker =
       std::
       _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/signal.h:110:23)>
       ::_M_invoke;
  (value->f).super__Function_base._M_manager =
       std::
       _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/signal.h:110:23)>
       ::_M_manager;
  safe_list<obs::slot<void_(int)>_>::push_back(&this->m_slots,value);
  cVar2.m_slot = (slot_base *)value;
  cVar2.m_signal = &this->super_signal_base;
  return cVar2;
}

Assistant:

connection connect(void (Class::*m)(Args...args), Class* t) {
    return add_slot(new slot_type(
                      [=](Args...args) {
                        (t->*m)(std::forward<Args>(args)...);
                      }));
  }